

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Own<kj::WebSocket> __thiscall
kj::anon_unknown_31::upgradeToWebSocket
          (anon_unknown_31 *this,Own<kj::AsyncIoStream> *stream,HttpInputStreamImpl *httpInput,
          HttpOutputStream *httpOutput,Maybe<kj::EntropySource_&> maskKeyGenerator)

{
  Own<kj::AsyncIoStream> *params;
  Array<unsigned_char> *params_2;
  WebSocket *extraout_RDX;
  Own<kj::WebSocket> OVar1;
  undefined1 local_78 [16];
  Own<kj::(anonymous_namespace)::WebSocketImpl> local_68;
  undefined1 local_58 [8];
  ReleasedBuffer releasedBuffer;
  HttpOutputStream *httpOutput_local;
  HttpInputStreamImpl *httpInput_local;
  Own<kj::AsyncIoStream> *stream_local;
  Maybe<kj::EntropySource_&> maskKeyGenerator_local;
  
  releasedBuffer.leftover.size_ = (size_t)httpOutput;
  stream_local = (Own<kj::AsyncIoStream> *)maskKeyGenerator.ptr;
  maskKeyGenerator_local.ptr = (EntropySource *)this;
  HttpInputStreamImpl::releaseBuffer((ReleasedBuffer *)local_58,httpInput);
  params = mv<kj::Own<kj::AsyncIoStream>>(stream);
  params_2 = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)local_58);
  HttpOutputStream::flush((HttpOutputStream *)local_78);
  heap<kj::(anonymous_namespace)::WebSocketImpl,kj::Own<kj::AsyncIoStream>,kj::Maybe<kj::EntropySource&>&,kj::Array<unsigned_char>,kj::ArrayPtr<unsigned_char>&,kj::Promise<void>>
            ((kj *)(local_78 + 0x10),params,(Maybe<kj::EntropySource_&> *)&stream_local,params_2,
             (ArrayPtr<unsigned_char> *)&releasedBuffer.buffer.disposer,(Promise<void> *)local_78);
  Own<kj::WebSocket>::Own<kj::(anonymous_namespace)::WebSocketImpl,void>
            ((Own<kj::WebSocket> *)this,
             (Own<kj::(anonymous_namespace)::WebSocketImpl> *)(local_78 + 0x10));
  Own<kj::(anonymous_namespace)::WebSocketImpl>::~Own
            ((Own<kj::(anonymous_namespace)::WebSocketImpl> *)(local_78 + 0x10));
  Promise<void>::~Promise((Promise<void> *)local_78);
  HttpInputStreamImpl::ReleasedBuffer::~ReleasedBuffer((ReleasedBuffer *)local_58);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<WebSocket> upgradeToWebSocket(
    kj::Own<kj::AsyncIoStream> stream, HttpInputStreamImpl& httpInput, HttpOutputStream& httpOutput,
    kj::Maybe<EntropySource&> maskKeyGenerator) {
  // Create a WebSocket upgraded from an HTTP stream.
  auto releasedBuffer = httpInput.releaseBuffer();
  return kj::heap<WebSocketImpl>(kj::mv(stream), maskKeyGenerator,
                                 kj::mv(releasedBuffer.buffer), releasedBuffer.leftover,
                                 httpOutput.flush());
}